

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O2

void __thiscall GMESong::GMESong(GMESong *this,Music_Emu *emu,int sample_rate)

{
  int iVar1;
  undefined4 extraout_var;
  
  StreamSong::StreamSong(&this->super_StreamSong);
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__GMESong_006ea4f8;
  FCriticalSection::FCriticalSection(&this->CritSec);
  this->Emu = emu;
  this->SampleRate = sample_rate;
  this->CurrTrack = 0;
  this->TrackInfo = (gme_info_t *)0x0;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])(GSnd,Read,0x8000,0,(ulong)(uint)sample_rate,this);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

GMESong::GMESong(Music_Emu *emu, int sample_rate)
{
	Emu = emu;
	SampleRate = sample_rate;
	CurrTrack = 0;
	TrackInfo = NULL;
	m_Stream = GSnd->CreateStream(Read, 32*1024, 0, sample_rate, this);
}